

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
detail::reader::operator()(reader *this,optional_field<example::decimal_t,_1UL> *val)

{
  bool bVar1;
  undefined8 uVar2;
  reference_type __position;
  optional_field<example::decimal_t,_1UL> local_4c;
  decimal_t local_40;
  decimal_t v;
  optional_field<example::decimal_t,_1UL> *val_local;
  reader *this_local;
  
  bVar1 = boost::optional<std::bitset<16UL>_>::operator!(&this->opts_);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x40);
    bad_message();
    __cxa_throw(uVar2,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  __position = boost::optional<std::bitset<16UL>_>::operator*(&this->opts_);
  std::bitset<16UL>::operator[]((bitset<16UL> *)&v,(size_t)__position);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&v);
  std::bitset<16UL>::reference::~reference((reference *)&v);
  if (bVar1) {
    example::decimal_t::decimal_t(&local_40,'\0',0);
    operator()(this,&local_40);
    example::optional_field<example::decimal_t,_1UL>::optional_field(&local_4c,local_40);
    example::optional_field<example::decimal_t,_1UL>::operator=(val,&local_4c);
    example::optional_field<example::decimal_t,_1UL>::~optional_field(&local_4c);
  }
  return;
}

Assistant:

void operator()(example::optional_field<T, N> & val) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
            val = example::optional_field<T, N>(std::move(v));
        }
    }